

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
TargetArtifactBase::GetTarget
          (TargetArtifactBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  string *input;
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  cmGeneratorTarget *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string sStack_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_01 = &sStack_88;
  input = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = cmGeneratorExpression::IsValidTargetName(input);
  if (bVar1) {
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,input);
    if (this_00 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
      std::operator+(&local_48,"No target \"",input);
      std::operator+(&sStack_88,&local_48,"\"");
      reportError(context,&local_68,&sStack_88);
    }
    else {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (((int)TVar2 < 4) ||
         (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == UNKNOWN_LIBRARY)) {
        if (dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) {
          return this_00;
        }
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(dagChecker,this_00,ANY);
        if (!bVar1) {
          bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
          if (!bVar1) {
            return this_00;
          }
          pcVar3 = cmGeneratorExpressionDAGChecker::TopTarget(dagChecker);
          if (this_00 != pcVar3) {
            return this_00;
          }
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_88,
                   "Expressions which require the linker language may not be used while evaluating link libraries"
                   ,(allocator<char> *)&local_48);
        reportError(context,&local_68,&sStack_88);
        this_01 = &sStack_88;
        goto LAB_0041cc63;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
      std::operator+(&local_48,"Target \"",input);
      std::operator+(&sStack_88,&local_48,"\" is not an executable or library.");
      reportError(context,&local_68,&sStack_88);
    }
    std::__cxx11::string::~string((string *)&sStack_88);
    this_01 = &local_48;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_88,"Expression syntax not recognized.",(allocator<char> *)&local_48
              );
    reportError(context,&local_68,&sStack_88);
  }
LAB_0041cc63:
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&local_68);
  return (cmGeneratorTarget *)0x0;
}

Assistant:

cmGeneratorTarget* GetTarget(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const
  {
    // Lookup the referenced target.
    std::string const& name = parameters.front();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return nullptr;
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return nullptr;
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Target \"" + name +
                      "\" is not an executable or library.");
      return nullptr;
    }
    if (dagChecker &&
        (dagChecker->EvaluatingLinkLibraries(target) ||
         (dagChecker->EvaluatingSources() &&
          target == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return nullptr;
    }

    return target;
  }